

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

bool __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::insert_no_grow(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
                 *this,insert_result *result,cluster_id *k,uint *v)

{
  raw_node *prVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  value_type *pDst;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar3 = (uint)((int)k->m_hash * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
  prVar1 = (this->m_values).m_p;
  pDst = (value_type *)(prVar1 + uVar3);
  uVar4 = uVar3;
  if (prVar1[uVar3].m_bits[0x1c] == '\0') {
LAB_0013b427:
    if (this->m_grow_threshold <= this->m_num_valid) {
      return false;
    }
    construct_value_type(pDst,k,v);
    pDst->field_0x1c = 1;
    this->m_num_valid = this->m_num_valid + 1;
    bVar2 = true;
  }
  else {
    bVar2 = qdxt1::cluster_id::operator==((cluster_id *)pDst,k);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      uVar5 = (ulong)uVar3;
      do {
        if ((int)uVar5 == 0) {
          uVar5 = (ulong)((this->m_values).m_size - 1);
          pDst = (value_type *)((this->m_values).m_p + uVar5);
        }
        else {
          uVar5 = (ulong)((int)uVar5 - 1);
          pDst = pDst + -1;
        }
        uVar4 = (uint)uVar5;
        if (uVar3 == uVar4) {
          return false;
        }
        if (pDst->field_0x1c == '\0') goto LAB_0013b427;
        bVar2 = qdxt1::cluster_id::operator==(&pDst->first,k);
      } while (!bVar2);
      bVar2 = false;
    }
  }
  (result->first).m_pTable = this;
  (result->first).m_index = uVar4;
  result->second = bVar2;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value()) {
    if (!m_values.size())
      return false;

    int index = hash_key(k);
    node* pNode = &get_node(index);

    if (pNode->state) {
      if (m_equals(pNode->first, k)) {
        result.first = iterator(*this, index);
        result.second = false;
        return true;
      }

      const int orig_index = index;

      for (;;) {
        if (!index) {
          index = m_values.size() - 1;
          pNode = &get_node(index);
        } else {
          index--;
          pNode--;
        }

        if (orig_index == index)
          return false;

        if (!pNode->state)
          break;

        if (m_equals(pNode->first, k)) {
          result.first = iterator(*this, index);
          result.second = false;
          return true;
        }
      }
    }

    if (m_num_valid >= m_grow_threshold)
      return false;

    construct_value_type(pNode, k, v);

    pNode->state = cStateValid;

    m_num_valid++;
    CRNLIB_ASSERT(m_num_valid <= m_values.size());

    result.first = iterator(*this, index);
    result.second = true;

    return true;
  }